

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

void wasm_module_imports(wasm_module_t *module,wasm_importtype_vec_t *out)

{
  if (((module->super_wasm_ref_t).I.obj_)->kind_ == Module) {
    wasm_module_imports_cold_1();
    return;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                ,0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Module, Base = wabt::interp::Object]"
               );
}

Assistant:

void wasm_module_imports(const wasm_module_t* module,
                         own wasm_importtype_vec_t* out) {
  auto&& import_types = module->As<Module>()->import_types();
  TRACE("%" PRIzx, import_types.size());
  wasm_importtype_vec_new_uninitialized(out, import_types.size());

  for (size_t i = 0; i < import_types.size(); ++i) {
    out->data[i] = new wasm_importtype_t{import_types[i]};
  }
}